

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

FrameOpResult __thiscall QRhi::endOffscreenFrame(QRhi *this,EndFrameFlags flags)

{
  ulong uVar1;
  byte bVar2;
  FrameOpResult FVar3;
  Data *pDVar4;
  ulong uVar5;
  Span *in_RDX;
  Span *extraout_RDX;
  Span *extraout_RDX_00;
  QRhiImplementation *pQVar6;
  long in_FS_OFFSET;
  const_iterator begin;
  const_iterator end;
  Data<QHashPrivate::Node<QRhiResource_*,_QHashDummyValue>_> local_58;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = this->d;
  bVar2 = pQVar6->inFrame;
  if ((bool)bVar2 == false) {
    local_58.ref.atomic._q_value.super___atomic_base<int>._M_i = (QBasicAtomicInt)(Type)0x2;
    local_58._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    local_58.numBuckets._0_4_ = 0;
    local_58.numBuckets._4_4_ = 0;
    local_58.seed = 0x6a102e;
    QMessageLogger::warning
              ((char *)&local_58,
               "Attempted to call endOffscreenFrame() without an active frame; ignored");
    pQVar6 = this->d;
    bVar2 = pQVar6->inFrame;
    in_RDX = extraout_RDX_00;
  }
  FVar3 = FrameOpSuccess;
  if ((bVar2 & 1) != 0) {
    FVar3 = (*pQVar6->_vptr_QRhiImplementation[0x12])
                      (pQVar6,(ulong)(uint)flags.super_QFlagsStorageHelper<QRhi::EndFrameFlag,_4>.
                                           super_QFlagsStorage<QRhi::EndFrameFlag>.i);
    pQVar6 = this->d;
    in_RDX = extraout_RDX;
  }
  pQVar6->inFrame = false;
  pDVar4 = (pQVar6->pendingDeleteResources).q_hash.d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    in_RDX = pDVar4->spans;
    if (in_RDX->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar1 = uVar5 + 1;
      } while (in_RDX[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_004511f1;
    }
  }
  uVar5 = 0;
LAB_004511f1:
  local_58.ref.atomic._q_value.super___atomic_base<int>._M_i = SUB84(pDVar4,0);
  local_58._4_4_ = SUB84((ulong)pDVar4 >> 0x20,0);
  local_58.size._0_4_ = (undefined4)uVar5;
  local_58.size._4_4_ = (undefined4)(uVar5 >> 0x20);
  local_58.spans = (Span *)0x0;
  uStack_30 = 0;
  begin.i.i.bucket = (size_t)&local_58.spans;
  begin.i.i.d = &local_58;
  end.i.i.bucket = uVar5;
  end.i.i.d = (Data<QHashPrivate::Node<QRhiResource_*,_QHashDummyValue>_> *)in_RDX;
  qDeleteAll<QSet<QRhiResource*>::const_iterator>(begin,end);
  QHash<QRhiResource_*,_QHashDummyValue>::clear(&(this->d->pendingDeleteResources).q_hash);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return FVar3;
}

Assistant:

QRhi::FrameOpResult QRhi::endOffscreenFrame(EndFrameFlags flags)
{
    if (!d->inFrame)
        qWarning("Attempted to call endOffscreenFrame() without an active frame; ignored");

    QRhi::FrameOpResult r = d->inFrame ? d->endOffscreenFrame(flags) : FrameOpSuccess;
    d->inFrame = false;
    qDeleteAll(d->pendingDeleteResources);
    d->pendingDeleteResources.clear();

    return r;
}